

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateFunction::
     StateCombine<duckdb::BitState<unsigned_long>,duckdb::BitAndOperation>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  idx_t iVar6;
  
  if (count != 0) {
    lVar1 = *(long *)(source + 0x20);
    lVar2 = *(long *)(target + 0x20);
    iVar6 = 0;
    do {
      pcVar3 = *(char **)(lVar1 + iVar6 * 8);
      if (*pcVar3 == '\x01') {
        pcVar4 = *(char **)(lVar2 + iVar6 * 8);
        uVar5 = *(ulong *)(pcVar3 + 8);
        if (*pcVar4 == '\0') {
          *(ulong *)(pcVar4 + 8) = uVar5;
          *pcVar4 = '\x01';
        }
        else {
          *(ulong *)(pcVar4 + 8) = *(ulong *)(pcVar4 + 8) & uVar5;
        }
      }
      iVar6 = iVar6 + 1;
    } while (count != iVar6);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}